

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O2

void __thiscall LZ77Compressor::add(LZ77Compressor *this,uint8_t *bytes,int offset)

{
  long lVar1;
  value_type_conflict2 local_4;
  
  lVar1 = (long)offset;
  std::vector<int,_std::allocator<int>_>::push_back
            (this->dict +
             ((ulong)bytes[lVar1 + 2] << 2 ^
             (ulong)((uint)bytes[lVar1 + 1] * 2) ^ (ulong)bytes[lVar1]),&local_4);
  return;
}

Assistant:

void add(const uint8_t* bytes, int offset) {
		dict[hash(bytes + offset)].push_back(offset);
	}